

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O3

int wc_match_fragment(char **fragment,char **target,char *target_end)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  byte bVar8;
  long lVar9;
  
  pbVar6 = (byte *)*fragment;
  pbVar5 = (byte *)*target;
LAB_0016e5f6:
  bVar8 = *pbVar6;
  if ((bVar8 != 0) && (bVar8 != 0x2a)) {
    if (pbVar5 < target_end) {
      if (bVar8 == 0x3f) goto LAB_0016e6fc;
      if (bVar8 == 0x5b) {
        pbVar1 = pbVar6 + 1;
        pbVar2 = pbVar6 + 1;
        pbVar6 = pbVar6 + 2;
        if (*pbVar2 != 0x5e) {
          pbVar6 = pbVar1;
        }
        bVar7 = false;
LAB_0016e65f:
        bVar8 = *pbVar6;
        if (bVar8 == 0x5c) {
          bVar8 = pbVar6[1];
          pbVar6 = pbVar6 + 1;
        }
        else if (bVar8 == 0x5d) goto LAB_0016e707;
        if (bVar8 == 0) {
          return -2;
        }
        if (pbVar6[1] == 0x2d) {
          bVar3 = pbVar6[2];
          if (bVar3 == 0x5c) {
            bVar3 = pbVar6[3];
            lVar9 = 3;
          }
          else {
            if (bVar3 == 0x5d) {
              return -3;
            }
            lVar9 = 2;
          }
          if (bVar3 == 0) {
            return -2;
          }
          bVar4 = bVar3;
          if (bVar8 < bVar3) {
            bVar4 = bVar8;
          }
          pbVar6 = pbVar6 + lVar9 + 1;
          if (bVar3 < bVar8) {
            bVar3 = bVar8;
          }
          bVar7 = (bool)(bVar7 | (*pbVar5 <= bVar3 && bVar4 <= *pbVar5));
        }
        else {
          pbVar6 = pbVar6 + 1;
          bVar7 = (bool)(bVar7 | *pbVar5 == bVar8);
        }
        goto LAB_0016e65f;
      }
      if (bVar8 != 0x5c) {
        if (bVar8 != *pbVar5) {
          return 0;
        }
        goto LAB_0016e6fc;
      }
      if (pbVar6[1] == 0) {
        return -1;
      }
      if (pbVar6[1] != *pbVar5) {
        return 0;
      }
      pbVar6 = pbVar6 + 2;
      goto LAB_0016e6ff;
    }
    if (bVar8 != 0) {
      return 0;
    }
  }
  *fragment = (char *)pbVar6;
  *target = (char *)pbVar5;
  return 1;
LAB_0016e707:
  if ((*pbVar2 == 0x5e) == bVar7) {
    return 0;
  }
LAB_0016e6fc:
  pbVar6 = pbVar6 + 1;
LAB_0016e6ff:
  pbVar5 = pbVar5 + 1;
  goto LAB_0016e5f6;
}

Assistant:

static int wc_match_fragment(const char **fragment, const char **target,
                             const char *target_end)
{
    const char *f, *t;

    f = *fragment;
    t = *target;
    /*
     * The fragment terminates at either the end of the string, or
     * the first (unescaped) *.
     */
    while (*f && *f != '*' && t < target_end) {
        /*
         * Extract one character from t, and one character's worth
         * of pattern from f, and step along both. Return 0 if they
         * fail to match.
         */
        if (*f == '\\') {
            /*
             * Backslash, which means f[1] is to be treated as a
             * literal character no matter what it is. It may not
             * be the end of the string.
             */
            if (!f[1])
                return -WC_TRAILINGBACKSLASH;   /* error */
            if (f[1] != *t)
                return 0;              /* failed to match */
            f += 2;
        } else if (*f == '?') {
            /*
             * Question mark matches anything.
             */
            f++;
        } else if (*f == '[') {
            bool invert = false;
            bool matched = false;
            /*
             * Open bracket introduces a character class.
             */
            f++;
            if (*f == '^') {
                invert = true;
                f++;
            }
            while (*f != ']') {
                if (*f == '\\')
                    f++;               /* backslashes still work */
                if (!*f)
                    return -WC_UNCLOSEDCLASS;   /* error again */
                if (f[1] == '-') {
                    int lower, upper, ourchr;
                    lower = (unsigned char) *f++;
                    f++;               /* eat the minus */
                    if (*f == ']')
                        return -WC_INVALIDRANGE;   /* different error! */
                    if (*f == '\\')
                        f++;           /* backslashes _still_ work */
                    if (!*f)
                        return -WC_UNCLOSEDCLASS;   /* error again */
                    upper = (unsigned char) *f++;
                    ourchr = (unsigned char) *t;
                    if (lower > upper) {
                        int t = lower; lower = upper; upper = t;
                    }
                    if (ourchr >= lower && ourchr <= upper)
                        matched = true;
                } else {
                    matched |= (*t == *f++);
                }
            }
            if (invert == matched)
                return 0;              /* failed to match character class */
            f++;                       /* eat the ] */
        } else {
            /*
             * Non-special character matches itself.
             */
            if (*f != *t)
                return 0;
            f++;
        }
        /*
         * Now we've done that, increment t past the character we
         * matched.
         */
        t++;
    }
    if (!*f || *f == '*') {
        /*
         * We have reached the end of f without finding a mismatch;
         * so we're done. Update the caller pointers and return 1.
         */
        *fragment = f;
        *target = t;
        return 1;
    }
    /*
     * Otherwise, we must have reached the end of t before we
     * reached the end of f; so we've failed. Return 0.
     */
    return 0;
}